

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_depth_decomposition.h
# Opt level: O3

ArrayIDIDFunc *
compute_tree_depth_order_of_connected_graph<main::__0>
          (ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *tail,ArrayIDIDFunc *head,
          anon_class_8_1_f6d195b4 *compute_separator,int tree_depth_must_be_below)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined1 auVar8 [64];
  bool bVar9;
  int iVar10;
  uint uVar11;
  ArrayIDIDFunc *pAVar12;
  unsigned_long *__s;
  uint *puVar13;
  void *__s_00;
  int *piVar14;
  ArrayIDIDFunc *extraout_RAX;
  ArrayIDIDFunc *extraout_RAX_00;
  long lVar15;
  ulong uVar16;
  int node_end;
  size_t sVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  int node_begin;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  int best_order_depth;
  int order_end;
  ArrayIDIDFunc nd_order;
  ArrayIDIDFunc sub_tail;
  ArrayIDFunc<int> depth;
  vector<int,_std::allocator<int>_> separator_node_depth;
  ArrayIDIDFunc sub_to_super;
  ArrayIDIDFunc sub_head;
  vector<int,_std::allocator<int>_> separator;
  BitIDFunc is_in_separator;
  ArrayIDIDMultiFunc successor;
  int local_19c;
  int local_198;
  int local_194;
  ArrayIDIDFunc local_190;
  ArrayIDIDFunc local_178;
  ArrayIDIDFunc local_160;
  ArrayIDFunc<int> local_148;
  anon_class_32_4_d72f82c3 local_138;
  ArrayIDIDFunc local_118;
  ArrayIDIDFunc local_100;
  vector<int,_std::allocator<int>_> local_e8;
  TinyIntIDFunc<1> local_d0;
  ArrayIDIDFunc *local_b8;
  ArrayIDIDFunc *local_b0;
  ArrayIDIDFunc *local_a8;
  uint *local_a0;
  uint *local_98;
  anon_class_32_4_7ef0cc76 local_90;
  anon_class_24_3_8acad44f local_70;
  ArrayIDIDMultiFunc local_58;
  undefined1 auVar27 [32];
  
  uVar11 = (tail->super_ArrayIDFunc<int>).preimage_count_;
  uVar19 = tail->image_count_;
  local_198 = tree_depth_must_be_below;
  if (uVar11 == uVar19 * 2 - 2) {
    pAVar12 = compute_tree_depth_order_of_tree<ArrayIDIDFunc,ArrayIDIDFunc>
                        (__return_storage_ptr__,tail,head);
    return pAVar12;
  }
  if (uVar11 == (uVar19 - 1) * uVar19) {
    (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = uVar19;
    if (uVar19 == 0) {
      (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = (int *)0x0;
      __return_storage_ptr__->image_count_ = 0;
      return (ArrayIDIDFunc *)(ulong)uVar11;
    }
    uVar18 = 0xffffffffffffffff;
    if (-1 < (int)uVar19) {
      uVar18 = (ulong)uVar19 * 4;
    }
    pAVar12 = (ArrayIDIDFunc *)operator_new__(uVar18);
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = (int *)pAVar12;
    __return_storage_ptr__->image_count_ = uVar19;
    if ((int)uVar19 < 1) {
      return pAVar12;
    }
    auVar22 = vpbroadcastq_avx512vl();
    auVar23 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    lVar15 = 0;
    auVar25._8_8_ = 8;
    auVar25._0_8_ = 8;
    auVar25._16_8_ = 8;
    auVar25._24_8_ = 8;
    auVar24._8_4_ = 8;
    auVar24._0_8_ = 0x800000008;
    auVar24._12_4_ = 8;
    auVar24._16_4_ = 8;
    auVar24._20_4_ = 8;
    auVar24._24_4_ = 8;
    auVar24._28_4_ = 8;
    do {
      vpcmpuq_avx512vl(auVar3,auVar22,2);
      vpcmpuq_avx512vl(auVar23,auVar22,2);
      auVar31 = vmovdqu32_avx512vl(auVar2);
      *(undefined1 (*) [32])((long)&(pAVar12->super_ArrayIDFunc<int>).preimage_count_ + lVar15) =
           auVar31;
      auVar3 = vpaddq_avx2(auVar3,auVar25);
      auVar23 = vpaddq_avx2(auVar23,auVar25);
      auVar2 = vpaddd_avx2(auVar2,auVar24);
      lVar15 = lVar15 + 0x20;
    } while ((ulong)(uVar19 + 7 >> 3) << 5 != lVar15);
    return pAVar12;
  }
  compute_greedy_order(&local_160,tail,head);
  local_19c = compute_tree_depth_of_order(tail,head,&local_160);
  iVar10 = local_198;
  if (local_19c < local_198) {
    iVar10 = local_19c;
  }
  compute_separator_by_running_bfs<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
            (&local_e8,tail,head,iVar10 + -1,compute_separator->rand_gen);
  local_98 = (uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  local_a0 = (uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_0011af68;
  local_70.tree_depth_must_be_below = &local_198;
  local_70.best_order_depth = &local_19c;
  uVar11 = tail->image_count_;
  local_70.compute_separator = (FastComputeSeparator *)compute_separator;
  compute_successor_function<ArrayIDIDFunc,ArrayIDIDFunc>(&local_58,tail,head);
  uVar19 = uVar11 + 0x3f;
  if ((int)(uVar11 + 0x3f) < 0) {
    uVar19 = uVar11 + 0x7e;
  }
  uVar19 = (int)uVar19 >> 6;
  local_d0.preimage_ = uVar11;
  local_d0.data_.preimage_count_ = uVar19;
  if (uVar11 + 0x7e < 0x7f) {
    local_d0.data_.data_ = (unsigned_long *)0x0;
    __s = (unsigned_long *)0x0;
    puVar13 = (uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
  }
  else {
    uVar18 = 0xffffffffffffffff;
    if (-0x7f < (int)uVar11) {
      uVar18 = (ulong)uVar19 << 3;
    }
    __s = (unsigned_long *)operator_new__(uVar18);
    local_d0.data_.data_ = __s;
    memset(__s,0,(long)(int)uVar19 << 3);
    puVar13 = (uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
  }
  for (; puVar13 !=
         (uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
    uVar19 = *puVar13;
    uVar20 = uVar19 + 0x3f;
    if (-1 < (int)uVar19) {
      uVar20 = uVar19;
    }
    __s[(int)uVar20 >> 6] =
         (ulong)(~(uint)(__s[(int)uVar20 >> 6] >> ((ulong)uVar19 & 0x3f)) & 1) <<
         ((ulong)uVar19 & 0x3f) ^ __s[(int)uVar20 >> 6];
  }
  local_178.super_ArrayIDFunc<int>.preimage_count_ = (tail->super_ArrayIDFunc<int>).preimage_count_;
  if ((long)local_178.super_ArrayIDFunc<int>.preimage_count_ == 0) {
    local_178.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    sVar17 = (long)local_178.super_ArrayIDFunc<int>.preimage_count_ << 2;
    uVar18 = 0xffffffffffffffff;
    if (-1 < local_178.super_ArrayIDFunc<int>.preimage_count_) {
      uVar18 = sVar17;
    }
    local_178.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar18);
    memmove(local_178.super_ArrayIDFunc<int>.data_,(tail->super_ArrayIDFunc<int>).data_,sVar17);
  }
  local_178.image_count_ = tail->image_count_;
  local_100.super_ArrayIDFunc<int>.preimage_count_ = (head->super_ArrayIDFunc<int>).preimage_count_;
  if ((long)local_100.super_ArrayIDFunc<int>.preimage_count_ == 0) {
    local_100.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    sVar17 = (long)local_100.super_ArrayIDFunc<int>.preimage_count_ << 2;
    uVar18 = 0xffffffffffffffff;
    if (-1 < local_100.super_ArrayIDFunc<int>.preimage_count_) {
      uVar18 = sVar17;
    }
    local_100.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar18);
    memmove(local_100.super_ArrayIDFunc<int>.data_,(head->super_ArrayIDFunc<int>).data_,sVar17);
  }
  local_100.image_count_ = head->image_count_;
  local_118.super_ArrayIDFunc<int>.preimage_count_ = uVar11;
  if (uVar11 == 0) {
    local_118.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    local_118.image_count_ = 0;
  }
  else {
    uVar18 = 0xffffffffffffffff;
    if (-1 < (int)uVar11) {
      uVar18 = (ulong)uVar11 * 4;
    }
    local_118.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar18);
    local_118.image_count_ = uVar11;
    if (0 < (int)uVar11) {
      auVar22 = vpbroadcastq_avx512vl();
      auVar23 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      lVar15 = 0;
      auVar31._8_8_ = 8;
      auVar31._0_8_ = 8;
      auVar31._16_8_ = 8;
      auVar31._24_8_ = 8;
      auVar33._8_4_ = 8;
      auVar33._0_8_ = 0x800000008;
      auVar33._12_4_ = 8;
      auVar33._16_4_ = 8;
      auVar33._20_4_ = 8;
      auVar33._24_4_ = 8;
      auVar33._28_4_ = 8;
      do {
        vpcmpuq_avx512vl(auVar3,auVar22,2);
        vpcmpuq_avx512vl(auVar23,auVar22,2);
        auVar25 = vmovdqu32_avx512vl(auVar2);
        *(undefined1 (*) [32])((long)local_118.super_ArrayIDFunc<int>.data_ + lVar15) = auVar25;
        auVar3 = vpaddq_avx2(auVar3,auVar31);
        auVar23 = vpaddq_avx2(auVar23,auVar31);
        auVar2 = vpaddd_avx2(auVar2,auVar33);
        lVar15 = lVar15 + 0x20;
      } while ((ulong)(uVar11 + 7 >> 3) << 5 != lVar15);
    }
  }
  inplace_remove_nodes_incident_to_node_set<TinyIntIDFunc<1>>
            (&local_178,&local_100,&local_118,&local_d0);
  inplace_reorder_nodes_and_arc_in_preorder(&local_178,&local_100,&local_118);
  local_148.preimage_count_ = uVar11;
  if (uVar11 == 0) {
    local_148.data_ = (int *)0x0;
    local_190.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_190.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    uVar18 = 0xffffffffffffffff;
    if (-1 < (int)uVar11) {
      uVar18 = (ulong)uVar11 * 4;
    }
    local_148.data_ = (int *)operator_new__(uVar18);
    auVar23 = vpbroadcastq_avx512vl();
    lVar15 = 0;
    auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar22._8_4_ = 1;
    auVar22._0_8_ = 0x100000001;
    auVar22._12_4_ = 1;
    auVar22._16_4_ = 1;
    auVar22._20_4_ = 1;
    auVar22._24_4_ = 1;
    auVar22._28_4_ = 1;
    do {
      auVar24 = vpbroadcastq_avx512vl();
      auVar25 = vpor_avx2(auVar24,auVar2);
      auVar24 = vpor_avx2(auVar24,auVar3);
      vpcmpuq_avx512vl(auVar24,auVar23,2);
      vpcmpuq_avx512vl(auVar25,auVar23,2);
      auVar25 = vmovdqu32_avx512vl(auVar22);
      *(undefined1 (*) [32])(local_148.data_ + lVar15) = auVar25;
      lVar15 = lVar15 + 8;
    } while ((((long)(int)uVar11 + 0x3fffffffffffffffU & 0x3fffffffffffffff) -
             (ulong)((uint)((long)(int)uVar11 + 0x3fffffffffffffffU) & 7)) + 8 != lVar15);
    local_190.super_ArrayIDFunc<int>.preimage_count_ = uVar11;
    local_190.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar18);
  }
  iVar28 = local_178.image_count_;
  iVar10 = local_178.super_ArrayIDFunc<int>.preimage_count_;
  local_90.order = &local_190;
  local_90.order_end = &local_194;
  local_194 = 0;
  local_90.compute_order_of_part = &local_70;
  local_90.depth = &local_148;
  uVar18 = (ulong)(uint)local_178.super_ArrayIDFunc<int>.preimage_count_;
  uVar19 = local_178.image_count_ + 0x3fU;
  if ((int)(local_178.image_count_ + 0x3fU) < 0) {
    uVar19 = local_178.image_count_ + 0x7eU;
  }
  local_190.image_count_ = uVar11;
  local_b8 = tail;
  local_a8 = head;
  if (local_178.image_count_ + 0x7eU < 0x7f) {
    __s_00 = (void *)0x0;
  }
  else {
    uVar16 = 0xffffffffffffffff;
    if (-0x7f < local_178.image_count_) {
      uVar16 = (ulong)(uint)((int)uVar19 >> 6) << 3;
    }
    __s_00 = operator_new__(uVar16);
    memset(__s_00,0xff,(long)((int)uVar19 >> 6) << 3);
  }
  if (0 < iVar10) {
    uVar16 = 0;
    do {
      uVar11 = local_178.super_ArrayIDFunc<int>.data_[uVar16];
      if (local_100.super_ArrayIDFunc<int>.data_[uVar16] < (int)uVar11) {
        uVar19 = uVar11 + 0x3f;
        if (-1 < (int)uVar11) {
          uVar19 = uVar11;
        }
        uVar1 = *(ulong *)((long)__s_00 + (long)((int)uVar19 >> 6) * 8);
        *(ulong *)((long)__s_00 + (long)((int)uVar19 >> 6) * 8) =
             (ulong)((uint)(uVar1 >> ((ulong)uVar11 & 0x3f)) & 1) << ((ulong)uVar11 & 0x3f) ^ uVar1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  local_138.tail = &local_178;
  local_138.head = &local_100;
  local_138.input_node_id = &local_118;
  local_138.callback = &local_90;
  node_begin = 0;
  uVar11 = 0;
  local_b0 = __return_storage_ptr__;
  if (1 < iVar28) {
    uVar11 = 0;
    uVar18 = 1;
    node_begin = 0;
    do {
      node_end = (int)uVar18;
      if ((*(ulong *)((long)__s_00 + (uVar18 >> 6) * 8) >> (uVar18 & 0x3f) & 1) != 0) {
        uVar19 = uVar11;
        if ((int)uVar11 < iVar10) {
          lVar15 = 0;
          do {
            if (node_end <= local_178.super_ArrayIDFunc<int>.data_[(int)uVar11 + lVar15]) {
              uVar19 = (int)lVar15 + uVar11;
              break;
            }
            lVar15 = lVar15 + 1;
            uVar19 = iVar10;
          } while ((long)iVar10 - (long)(int)uVar11 != lVar15);
        }
        bVar9 = forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:285:9)>
                ::anon_class_32_4_d72f82c3::operator()(&local_138,node_begin,node_end,uVar11,uVar19)
        ;
        node_begin = node_end;
        uVar11 = uVar19;
        if (!bVar9) goto LAB_0011aba3;
      }
      uVar18 = (ulong)(node_end + 1U);
    } while (node_end + 1U != iVar28);
  }
  forall_connected_components_with_nodes_and_arcs_in_preorder<ArrayIDIDFunc,_ArrayIDIDFunc,_ArrayIDIDFunc,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ben-strasser[P]flow-cutter-pace20/src/tree_depth_decomposition.h:285:9)>
  ::anon_class_32_4_d72f82c3::operator()(&local_138,node_begin,iVar28,uVar11,iVar10);
LAB_0011aba3:
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  pAVar12 = local_a8;
  __return_storage_ptr__ = local_b0;
  if (local_190.super_ArrayIDFunc<int>.preimage_count_ != 0) {
    uVar11 = (uint)((ulong)((long)local_98 - (long)local_a0) >> 2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_138,(long)(int)uVar11,
               (allocator_type *)&local_90);
    if (0 < (int)uVar11) {
      uVar18 = 0;
      auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      do {
        iVar10 = local_58.preimage_to_intermediate.range_begin.data_
                 [local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18]];
        iVar28 = 0;
        if (iVar10 != local_58.preimage_to_intermediate.range_begin.data_
                      [(long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18] + 1]) {
          auVar23 = vpbroadcastq_avx512vl();
          auVar23 = vpsrlq_avx2(auVar23,2);
          uVar16 = 0;
          auVar8 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar29 = auVar8;
            auVar25 = vpbroadcastq_avx512vl();
            auVar22 = vpor_avx2(auVar25,auVar2);
            auVar25 = vpor_avx2(auVar25,auVar3);
            uVar4 = vpcmpuq_avx512vl(auVar25,auVar23,2);
            bVar7 = (byte)uVar4;
            uVar4 = vpcmpuq_avx512vl(auVar22,auVar23,2);
            bVar6 = (byte)uVar4;
            bVar5 = bVar6 << 4;
            vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                (local_58.intermediate_to_image.super_ArrayIDFunc<int>.data_ +
                                (long)iVar10 + uVar16));
            auVar22 = vpgatherdd_avx512vl(*local_148.data_);
            auVar26._4_4_ = (uint)((bVar7 & 2) >> 1) * auVar22._4_4_;
            auVar26._0_4_ = (uint)(bVar7 & 1) * auVar22._0_4_;
            auVar26._8_4_ = (uint)((bVar7 & 4) >> 2) * auVar22._8_4_;
            auVar26._12_4_ = (uint)((bVar7 & 0xf) >> 3) * auVar22._12_4_;
            auVar26._16_4_ = (uint)(bVar6 & 1) * auVar22._16_4_;
            auVar26._20_4_ = (uint)(bVar5 >> 5 & 1) * auVar22._20_4_;
            auVar26._24_4_ = (uint)(bVar5 >> 6 & 1) * auVar22._24_4_;
            auVar26._28_4_ = (uint)(bVar5 >> 7) * auVar22._28_4_;
            auVar22 = vpmaxsd_avx2(auVar26,auVar29._0_32_);
            uVar16 = uVar16 + 8;
            auVar8 = ZEXT3264(auVar22);
          } while (((((long)local_58.preimage_to_intermediate.range_begin.data_
                            [(long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar18] + 1] * 4 +
                     (long)iVar10 * -4) - 4U >> 2) + 8 & 0xfffffffffffffff8) != uVar16);
          auVar23 = vmovdqa32_avx512vl(auVar22);
          auVar21._0_4_ =
               (uint)(bVar7 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar29._0_4_;
          bVar9 = (bool)((bVar7 & 2) >> 1);
          auVar21._4_4_ = (uint)bVar9 * auVar23._4_4_ | (uint)!bVar9 * auVar29._4_4_;
          bVar9 = (bool)((bVar7 & 4) >> 2);
          auVar21._8_4_ = (uint)bVar9 * auVar23._8_4_ | (uint)!bVar9 * auVar29._8_4_;
          bVar9 = (bool)((bVar7 & 0xf) >> 3);
          auVar21._12_4_ = (uint)bVar9 * auVar23._12_4_ | (uint)!bVar9 * auVar29._12_4_;
          auVar27._16_4_ =
               (uint)(bVar6 & 1) * auVar23._16_4_ | (uint)!(bool)(bVar6 & 1) * auVar29._16_4_;
          auVar27._0_16_ = auVar21;
          bVar9 = (bool)(bVar5 >> 5 & 1);
          auVar27._20_4_ = (uint)bVar9 * auVar23._20_4_ | (uint)!bVar9 * auVar29._20_4_;
          bVar9 = (bool)(bVar5 >> 6 & 1);
          auVar27._24_4_ = (uint)bVar9 * auVar23._24_4_ | (uint)!bVar9 * auVar29._24_4_;
          auVar27._28_4_ =
               (uint)(bVar5 >> 7) * auVar23._28_4_ | (uint)!(bool)(bVar5 >> 7) * auVar29._28_4_;
          auVar21 = vpmaxsd_avx(auVar21,auVar27._16_16_);
          auVar30 = vpshufd_avx(auVar21,0xee);
          auVar21 = vpmaxsd_avx(auVar21,auVar30);
          auVar30 = vpsrlq_avx(auVar21,0x20);
          auVar21 = vpmaxsd_avx(auVar21,auVar30);
          iVar28 = auVar21._0_4_;
        }
        (&((local_138.tail)->super_ArrayIDFunc<int>).preimage_count_)[uVar18] = iVar28;
        uVar18 = uVar18 + 1;
      } while (uVar18 != (uVar11 & 0x7fffffff));
    }
    uVar18 = (ulong)((long)local_138.head - (long)local_138.tail) >> 2;
    iVar10 = (int)uVar18;
    if (iVar10 == 0) {
      piVar14 = (int *)0x0;
    }
    else {
      uVar16 = 0xffffffffffffffff;
      if (-1 < iVar10) {
        uVar16 = (uVar18 & 0xffffffff) * 4;
      }
      piVar14 = (int *)operator_new__(uVar16);
      if (0 < iVar10) {
        auVar23 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
        auVar22 = vpbroadcastq_avx512vl();
        uVar16 = 0;
        auVar32._8_8_ = 8;
        auVar32._0_8_ = 8;
        auVar32._16_8_ = 8;
        auVar32._24_8_ = 8;
        auVar34._8_4_ = 8;
        auVar34._0_8_ = 0x800000008;
        auVar34._12_4_ = 8;
        auVar34._16_4_ = 8;
        auVar34._20_4_ = 8;
        auVar34._24_4_ = 8;
        auVar34._28_4_ = 8;
        do {
          vpcmpuq_avx512vl(auVar3,auVar22,2);
          vpcmpuq_avx512vl(auVar23,auVar22,2);
          auVar25 = vmovdqu32_avx512vl(auVar2);
          *(undefined1 (*) [32])(piVar14 + uVar16) = auVar25;
          uVar16 = uVar16 + 8;
          auVar3 = vpaddq_avx2(auVar3,auVar32);
          auVar23 = vpaddq_avx2(auVar23,auVar32);
          auVar2 = vpaddd_avx2(auVar2,auVar34);
        } while ((iVar10 + 7U & 0xfffffff8) != uVar16);
      }
    }
    if ((uVar18 & 0xffffffff) != 0) {
      std::
      __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<compute_separator_node_order(std::vector<int,std::allocator<int>>const&)::_lambda(int,int)_1_>>
                (piVar14,piVar14 + iVar10,(ulong)(uint)((int)LZCOUNT((long)iVar10) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_tree_depth_decomposition_h:235:43)>
                  )&local_138);
      std::
      __final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<compute_separator_node_order(std::vector<int,std::allocator<int>>const&)::_lambda(int,int)_1_>>
                (piVar14,piVar14 + iVar10,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_tree_depth_decomposition_h:235:43)>
                  )&local_138);
    }
    if ((int)uVar11 < 1) {
      if (piVar14 != (int *)0x0) goto LAB_0011ae45;
    }
    else {
      uVar18 = 0;
      do {
        lVar15 = (long)local_194;
        local_194 = local_194 + 1;
        local_190.super_ArrayIDFunc<int>.data_[lVar15] =
             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[piVar14[uVar18]];
        uVar18 = uVar18 + 1;
      } while ((uVar11 & 0x7fffffff) != uVar18);
LAB_0011ae45:
      operator_delete__(piVar14);
    }
    if (local_138.tail != (ArrayIDIDFunc *)0x0) {
      operator_delete(local_138.tail);
    }
  }
  if (local_148.data_ != (int *)0x0) {
    operator_delete__(local_148.data_);
  }
  if (local_118.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_118.super_ArrayIDFunc<int>.data_);
  }
  if (local_100.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_100.super_ArrayIDFunc<int>.data_);
  }
  if (local_178.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_178.super_ArrayIDFunc<int>.data_);
  }
  if (local_d0.data_.data_ != (unsigned_long *)0x0) {
    operator_delete__(local_d0.data_.data_);
  }
  if (local_58.intermediate_to_image.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_58.intermediate_to_image.super_ArrayIDFunc<int>.data_);
  }
  if (local_58.preimage_to_intermediate.range_begin.data_ != (int *)0x0) {
    operator_delete__(local_58.preimage_to_intermediate.range_begin.data_);
  }
  if ((local_190.super_ArrayIDFunc<int>.preimage_count_ == 0) ||
     (iVar10 = compute_tree_depth_of_order(local_b8,pAVar12,&local_190), local_19c <= iVar10)) {
    if (local_190.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_190.super_ArrayIDFunc<int>.data_);
    }
  }
  else {
    if (local_160.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_160.super_ArrayIDFunc<int>.data_);
    }
    local_160.super_ArrayIDFunc<int>.preimage_count_ =
         local_190.super_ArrayIDFunc<int>.preimage_count_;
    local_190.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_160.super_ArrayIDFunc<int>.data_ = local_190.super_ArrayIDFunc<int>.data_;
    local_190.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    local_160.image_count_ = local_190.image_count_;
    local_19c = iVar10;
  }
LAB_0011af68:
  piVar14 = local_160.super_ArrayIDFunc<int>.data_;
  uVar11 = local_160.super_ArrayIDFunc<int>.preimage_count_;
  if (local_198 < local_19c) {
    uVar11 = 0;
    piVar14 = (int *)0x0;
    uVar19 = 0;
  }
  else {
    local_160.super_ArrayIDFunc<int>.preimage_count_ = 0;
    local_160.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    uVar19 = local_160.image_count_;
  }
  pAVar12 = (ArrayIDIDFunc *)(ulong)uVar11;
  (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = uVar11;
  (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar14;
  __return_storage_ptr__->image_count_ = uVar19;
  if ((uint *)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pAVar12 = extraout_RAX;
  }
  if (local_160.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_160.super_ArrayIDFunc<int>.data_);
    pAVar12 = extraout_RAX_00;
  }
  return pAVar12;
}

Assistant:

ArrayIDIDFunc compute_tree_depth_order_of_connected_graph(
    ArrayIDIDFunc tail, ArrayIDIDFunc head,
    const ComputeSeparator& compute_separator,
    int tree_depth_must_be_below)
{
    assert(tail.preimage_count() == head.preimage_count());
    assert(tail.image_count() == head.image_count());
    assert(is_symmetric(tail, head));

    const int node_count = tail.image_count();
    const int arc_count = tail.preimage_count();
    bool is_tree = (arc_count == 2 * (node_count - 1));
    bool is_clique = (arc_count == (node_count) * (node_count - 1));

    if (is_tree) {
        return compute_tree_depth_order_of_tree(std::move(tail), std::move(head));
    } else if (is_clique) {
        return identity_permutation(node_count);
    } else {
        ArrayIDIDFunc best_order = compute_greedy_order(tail, head);
        int best_order_depth = compute_tree_depth_of_order(tail, head, best_order);

        // If we computed a separator with size tree_depth_must_be_below or more, then the tree depth would also be at least tree_depth_must_be_below as the separator forms a path.
        // If we computed a separator with size best_order_depth or more, then it cannot be better than best_order_depth as the separator forms a path.
        std::vector<int> separator = compute_separator(tail, head, std::min(tree_depth_must_be_below, best_order_depth) - 1);
        if (!separator.empty()) {
            ArrayIDIDFunc nd_order = compute_nested_disection_order_by_splitting_along_separator(
                tail, head, separator,
                [&](ArrayIDIDFunc sub_tail, ArrayIDIDFunc sub_head) {
                    return compute_tree_depth_order_of_connected_graph(std::move(sub_tail), std::move(sub_head), compute_separator, std::min(tree_depth_must_be_below, best_order_depth) - 1);
                });
            if(nd_order.preimage_count() != 0){
                int nd_order_depth = compute_tree_depth_of_order(tail, head, nd_order);
                if (nd_order_depth < best_order_depth) {
                    best_order = std::move(nd_order);
                    best_order_depth = nd_order_depth;
                }
            }
        }

        if(best_order_depth > tree_depth_must_be_below)
            return ArrayIDIDFunc();
        else
            return std::move(best_order);
    }
}